

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractspinbox.cpp
# Opt level: O0

void QAbstractSpinBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar3;
  QFlagsStorage<Qt::AlignmentFlag> QVar4;
  QAbstractSpinBox *pQVar5;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QAbstractSpinBox *_t;
  undefined4 in_stack_ffffffffffffff48;
  CorrectionMode in_stack_ffffffffffffff4c;
  QAbstractSpinBox *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  bool shown;
  QAbstractSpinBox *in_stack_ffffffffffffff60;
  QAbstractSpinBox *in_stack_ffffffffffffff70;
  QFlagsStorage<Qt::AlignmentFlag> *pQVar6;
  
  QVar4.i = (Int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff60 = (QAbstractSpinBox *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff60) {
    case (QAbstractSpinBox *)0x0:
      editingFinished((QAbstractSpinBox *)0x68cbbe);
      break;
    case (QAbstractSpinBox *)0x1:
      returnPressed((QAbstractSpinBox *)0x68cbca);
      break;
    case (QAbstractSpinBox *)0x2:
      stepUp((QAbstractSpinBox *)0x68cbd6);
      break;
    case (QAbstractSpinBox *)0x3:
      stepDown((QAbstractSpinBox *)0x68cbe2);
      break;
    case (QAbstractSpinBox *)0x4:
      selectAll(in_stack_ffffffffffffff70);
      break;
    case (QAbstractSpinBox *)0x5:
      (**(code **)(*in_RDI + 0x1b8))();
    }
  }
  if ((in_ESI != 5) ||
     ((bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractSpinBox::*)()>
                         (in_RCX,(void **)editingFinished,0,0), !bVar2 &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractSpinBox::*)()>
                         (in_RCX,(void **)returnPressed,0,1), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar6 = *(QFlagsStorage<Qt::AlignmentFlag> **)in_RCX;
      pQVar5 = (QAbstractSpinBox *)(ulong)in_EDX;
      switch(pQVar5) {
      case (QAbstractSpinBox *)0x0:
        bVar2 = wrapping(in_stack_ffffffffffffff50);
        *(bool *)&((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)pQVar6)->
                  super_QFlagsStorage<Qt::AlignmentFlag> = bVar2;
        break;
      case (QAbstractSpinBox *)0x1:
        bVar2 = hasFrame(in_stack_ffffffffffffff50);
        *(bool *)&((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)pQVar6)->
                  super_QFlagsStorage<Qt::AlignmentFlag> = bVar2;
        break;
      case (QAbstractSpinBox *)0x2:
        QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             alignment((QAbstractSpinBox *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)pQVar6)->
        super_QFlagsStorage<Qt::AlignmentFlag> = QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i;
        break;
      case (QAbstractSpinBox *)0x3:
        bVar2 = isReadOnly(in_stack_ffffffffffffff50);
        *(bool *)&((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)pQVar6)->
                  super_QFlagsStorage<Qt::AlignmentFlag> = bVar2;
        break;
      case (QAbstractSpinBox *)0x4:
        QVar4.i = buttonSymbols(in_stack_ffffffffffffff50);
        pQVar6->i = QVar4.i;
        break;
      case (QAbstractSpinBox *)0x5:
        specialValueText(pQVar5);
        QString::operator=((QString *)in_stack_ffffffffffffff50,
                           (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
        QString::~QString((QString *)0x68cd7b);
        break;
      case (QAbstractSpinBox *)0x6:
        text(pQVar5);
        QString::operator=((QString *)in_stack_ffffffffffffff50,
                           (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
        QString::~QString((QString *)0x68cda8);
        break;
      case (QAbstractSpinBox *)0x7:
        bVar2 = isAccelerated(in_stack_ffffffffffffff50);
        *(bool *)&pQVar6->i = bVar2;
        break;
      case (QAbstractSpinBox *)0x8:
        QVar4.i = correctionMode(in_stack_ffffffffffffff50);
        pQVar6->i = QVar4.i;
        break;
      case (QAbstractSpinBox *)0x9:
        bVar2 = hasAcceptableInput(in_stack_ffffffffffffff50);
        *(bool *)&pQVar6->i = bVar2;
        break;
      case (QAbstractSpinBox *)0xa:
        bVar2 = keyboardTracking(in_stack_ffffffffffffff50);
        *(bool *)&pQVar6->i = bVar2;
        break;
      case (QAbstractSpinBox *)0xb:
        bVar2 = isGroupSeparatorShown(in_stack_ffffffffffffff50);
        *(bool *)&pQVar6->i = bVar2;
      }
      QVar4.i = (Int)((ulong)pQVar5 >> 0x20);
    }
    if (in_ESI == 2) {
      pQVar5 = (QAbstractSpinBox *)(ulong)in_EDX;
      bVar2 = SUB41(in_stack_ffffffffffffff4c >> 0x18,0);
      shown = SUB41(QVar4.i >> 0x18,0);
      switch(pQVar5) {
      case (QAbstractSpinBox *)0x0:
        setWrapping(pQVar5,bVar2);
        break;
      case (QAbstractSpinBox *)0x1:
        setFrame(in_stack_ffffffffffffff60,shown);
        break;
      case (QAbstractSpinBox *)0x2:
        setAlignment(pQVar5,(Alignment)QVar4.i);
        break;
      case (QAbstractSpinBox *)0x3:
        setReadOnly(*(QAbstractSpinBox **)in_RCX,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
        break;
      case (QAbstractSpinBox *)0x4:
        setButtonSymbols(in_stack_ffffffffffffff60,QVar4.i);
        break;
      case (QAbstractSpinBox *)0x5:
        setSpecialValueText(pQVar5,(QString *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        break;
      default:
        break;
      case (QAbstractSpinBox *)0x7:
        setAccelerated(pQVar5,bVar2);
        break;
      case (QAbstractSpinBox *)0x8:
        setCorrectionMode(pQVar5,in_stack_ffffffffffffff4c);
        break;
      case (QAbstractSpinBox *)0xa:
        setKeyboardTracking(pQVar5,bVar2);
        break;
      case (QAbstractSpinBox *)0xb:
        setGroupSeparatorShown(in_stack_ffffffffffffff60,shown);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractSpinBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->returnPressed(); break;
        case 2: _t->stepUp(); break;
        case 3: _t->stepDown(); break;
        case 4: _t->selectAll(); break;
        case 5: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::returnPressed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 4: *reinterpret_cast<ButtonSymbols*>(_v) = _t->buttonSymbols(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->specialValueText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isAccelerated(); break;
        case 8: *reinterpret_cast<CorrectionMode*>(_v) = _t->correctionMode(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->keyboardTracking(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->isGroupSeparatorShown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setButtonSymbols(*reinterpret_cast<ButtonSymbols*>(_v)); break;
        case 5: _t->setSpecialValueText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setAccelerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setCorrectionMode(*reinterpret_cast<CorrectionMode*>(_v)); break;
        case 10: _t->setKeyboardTracking(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setGroupSeparatorShown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}